

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeEnumDefinition(ExpressionContext *ctx,SynEnumDefinition *syntax)

{
  __jmp_buf_tag *__env;
  bool bVar1;
  Allocator *pAVar2;
  ScopeData *pSVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  TypeBase *pTVar7;
  undefined4 extraout_var;
  SynBase *pSVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TypeFunction *pTVar9;
  undefined4 extraout_var_02;
  TypeRef *pTVar11;
  ArgumentData *pAVar12;
  ExprVariableDefinition *pEVar13;
  undefined4 extraout_var_03;
  _func_int **pp_Var14;
  ExprBase *pEVar15;
  SynBase *pSVar16;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  ExprBase *pEVar17;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  ScopeData *pSVar18;
  uint i;
  char *pcVar19;
  char *in_R8;
  char *pcVar20;
  InplaceStr name;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  ArrayView<ArgumentData> arguments_00;
  InplaceStr name_03;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<ArgumentData> arguments_02;
  InplaceStr name_04;
  ArrayView<ArgumentData> arguments_03;
  IntrusiveList<SynConstant> constants;
  IntrusiveList<ExprBase> expressions;
  IntrusiveList<ExprVariableDefinition> variables;
  InplaceStr typeName;
  SmallArray<ArgumentData,_1U> arguments;
  undefined1 local_128 [16];
  SynIdentifier *local_118;
  TypeEnum *local_110;
  ExprBase *local_108;
  FunctionData *pFStack_100;
  jmp_buf prevErrorHandler;
  TypeEnum *this;
  FunctionData *pFVar10;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_12;
  
  name_02.end = in_R8;
  name_02.begin = (syntax->name->name).end;
  anon_unknown.dwarf_94284::CheckTypeConflict
            ((anon_unknown_dwarf_94284 *)ctx,(ExpressionContext *)syntax,
             (SynBase *)(syntax->name->name).begin,name_02);
  typeName = GetTypeNameInScope(ctx,ctx->scope,syntax->name->name);
  uVar4 = InplaceStr::hash(&typeName);
  pTVar7 = anon_unknown.dwarf_94284::LookupTypeByName(ctx,uVar4);
  if (pTVar7 != (TypeBase *)0x0) {
    anon_unknown.dwarf_94284::Stop
              (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
               (ulong)(uint)(*(int *)&(syntax->name->name).end - (int)(syntax->name->name).begin));
  }
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xe8);
  this = (TypeEnum *)CONCAT44(extraout_var,iVar5);
  SynIdentifier::SynIdentifier((SynIdentifier *)prevErrorHandler,syntax->name,typeName);
  pSVar18 = ctx->scope;
  TypeEnum::TypeEnum(this,(SynIdentifier *)prevErrorHandler,&syntax->super_SynBase,pSVar18);
  ExpressionContext::AddType(ctx,(TypeBase *)this);
  ExpressionContext::PushScope(ctx,(TypeBase *)this);
  (this->super_TypeStruct).typeScope = ctx->scope;
  constants.tail = (SynConstant *)pSVar18;
  constants.head = (syntax->values).head;
  AnalyzeEnumConstants(ctx,(TypeBase *)this,constants,&(this->super_TypeStruct).constants);
  (this->super_TypeStruct).super_TypeBase.alignment = ctx->typeInt->alignment;
  ExpressionContext::PopScope(ctx,SCOPE_TYPE);
  pSVar18 = ctx->scope;
  ctx->scope = ctx->globalScope;
  ctx->lookupLocation = (SynBase *)0x0;
  __env = ctx->errorHandler;
  memcpy(prevErrorHandler,__env,200);
  bVar1 = ctx->errorHandlerNested;
  ctx->errorHandlerNested = true;
  uVar4 = *(uint *)(NULLC::traceContext + 0x244);
  iVar5 = _setjmp((__jmp_buf_tag *)__env);
  if (iVar5 == 0) {
    pSVar8 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    arguments.allocator = ctx->allocator;
    arguments.data = arguments.little;
    arguments.little[0].source = (SynBase *)0x0;
    arguments.little[0].isExplicit = false;
    arguments.little[0].name = (SynIdentifier *)0x0;
    arguments.little[0].type = (TypeBase *)0x0;
    arguments.little[0].value = (ExprBase *)0x0;
    arguments.little[0].valueFunction = (FunctionData *)0x0;
    arguments.count = 0;
    arguments.max = 1;
    iVar5 = (*(arguments.allocator)->_vptr_Allocator[2])(arguments.allocator,0x50);
    name.end = "";
    name.begin = "$x";
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_00,iVar5),name);
    local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
    local_108 = (ExprBase *)0x0;
    pFStack_100 = (FunctionData *)0x0;
    local_128._0_8_ = pSVar8;
    local_118 = (SynIdentifier *)CONCAT44(extraout_var_00,iVar5);
    local_110 = this;
    SmallArray<ArgumentData,_1U>::push_back(&arguments,(ArgumentData *)local_128);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    name_00.end = "";
    name_00.begin = "int";
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_01,iVar5),name_00);
    arguments_00.count = arguments.count;
    arguments_00.data = arguments.data;
    arguments_00._12_4_ = 0;
    pTVar9 = ExpressionContext::GetFunctionType(ctx,pSVar8,ctx->typeInt,arguments_00);
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
    pFVar10 = (FunctionData *)CONCAT44(extraout_var_02,iVar6);
    pAVar2 = ctx->allocator;
    pSVar3 = ctx->scope;
    pTVar11 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    uVar4 = ctx->uniqueFunctionId;
    ctx->uniqueFunctionId = uVar4 + 1;
    pcVar19 = (char *)0x0;
    pcVar20 = pcVar19;
    FunctionData::FunctionData
              (pFVar10,pAVar2,pSVar8,pSVar3,false,false,false,pTVar9,&pTVar11->super_TypeBase,
               (SynIdentifier *)CONCAT44(extraout_var_01,iVar5),(IntrusiveList<MatchData>)ZEXT816(0)
               ,uVar4);
    while (uVar4 = (uint)pcVar19, uVar4 < arguments.count) {
      pAVar12 = SmallArray<ArgumentData,_1U>::operator[](&arguments,uVar4);
      SmallArray<ArgumentData,_4U>::push_back(&pFVar10->arguments,pAVar12);
      pcVar19 = (char *)(ulong)(uVar4 + 1);
    }
    name_03.end = pcVar20;
    name_03.begin = (pFVar10->name->name).end;
    anon_unknown.dwarf_94284::CheckFunctionConflict
              ((anon_unknown_dwarf_94284 *)ctx,(ExpressionContext *)syntax,
               (SynBase *)(pFVar10->name->name).begin,name_03);
    ExpressionContext::AddFunction(ctx,pFVar10);
    ExpressionContext::PushScope(ctx,pFVar10);
    pFVar10->functionScope = ctx->scope;
    variables.head = (ExprVariableDefinition *)0x0;
    variables.tail = (ExprVariableDefinition *)0x0;
    arguments_01.count = arguments.count;
    arguments_01.data = arguments.data;
    arguments_01._12_4_ = 0;
    CreateFunctionArgumentVariables(ctx,pSVar8,pFVar10,arguments_01,&variables);
    pEVar13 = CreateFunctionContextArgument(ctx,pSVar8,pFVar10);
    pFVar10->argumentsSize = pFVar10->functionScope->dataSize;
    expressions.head = (ExprBase *)0x0;
    expressions.tail = (ExprBase *)0x0;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    ExprVariableAccess::ExprVariableAccess
              ((ExprVariableAccess *)CONCAT44(extraout_var_03,iVar5),pSVar8,(TypeBase *)this,
               (variables.tail)->variable->variable);
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pp_Var14 = (_func_int **)CONCAT44(extraout_var_04,iVar6);
    pTVar7 = ctx->typeInt;
    *(undefined4 *)(pp_Var14 + 1) = 0x12;
    pp_Var14[2] = (_func_int *)pSVar8;
    pp_Var14[3] = (_func_int *)pTVar7;
    pp_Var14[4] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var14 + 5) = 0;
    *pp_Var14 = (_func_int *)&PTR__ExprBase_002239e8;
    pp_Var14[6] = (_func_int *)CONCAT44(extraout_var_03,iVar5);
    *(undefined4 *)(pp_Var14 + 7) = 0xd;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar15 = (ExprBase *)CONCAT44(extraout_var_05,iVar5);
    pTVar7 = ctx->typeVoid;
    pSVar16 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar8,pFVar10,ctx->scope);
    pEVar15->typeID = 0x1c;
    pEVar15->source = pSVar8;
    pEVar15->type = pTVar7;
    pEVar15->next = (ExprBase *)0x0;
    pEVar15->listed = false;
    pEVar15->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223b70;
    pEVar15[1]._vptr_ExprBase = pp_Var14;
    *(undefined8 *)&pEVar15[1].typeID = 0;
    pEVar15[1].source = pSVar16;
    IntrusiveList<ExprBase>::push_back(&expressions,pEVar15);
    ClosePendingUpvalues(ctx,pFVar10);
    ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
    pEVar15 = (ExprBase *)CONCAT44(extraout_var_06,iVar5);
    pTVar9 = pFVar10->type;
    local_128._0_8_ = expressions.head;
    local_128._8_8_ = expressions.tail;
    pEVar15->typeID = 0x24;
    pEVar15->source = pSVar8;
    pEVar15->type = &pTVar9->super_TypeBase;
    pEVar15->next = (ExprBase *)0x0;
    pEVar15->listed = false;
    pEVar15->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223ba8;
    pEVar15[1]._vptr_ExprBase = (_func_int **)pFVar10;
    *(ExprVariableDefinition **)&pEVar15[1].typeID = pEVar13;
    pEVar15[1].source = (SynBase *)variables.head;
    pEVar15[1].type = (TypeBase *)variables.tail;
    pEVar15[1].next = (ExprBase *)0x0;
    *(ExprBase **)&pEVar15[1].listed = expressions.head;
    pEVar15[2]._vptr_ExprBase = (_func_int **)expressions.tail;
    *(undefined8 *)&pEVar15[2].typeID = 0;
    pEVar15[2].source = (SynBase *)0x0;
    pFVar10->declaration = pEVar15;
    SmallArray<ExprBase_*,_128U>::push_back(&ctx->definitions,&pFVar10->declaration);
    pEVar15 = pFVar10->declaration;
    SmallArray<ArgumentData,_1U>::~SmallArray(&arguments);
    arguments.allocator = ctx->allocator;
    arguments.little[0].source = (SynBase *)0x0;
    arguments.little[0].isExplicit = false;
    arguments.little[0].name = (SynIdentifier *)0x0;
    arguments.little[0].type = (TypeBase *)0x0;
    arguments.little[0].value = (ExprBase *)0x0;
    arguments.little[0].valueFunction = (FunctionData *)0x0;
    arguments.data = arguments.little;
    arguments.count = 0;
    arguments.max = 1;
    iVar5 = (*(arguments.allocator)->_vptr_Allocator[2])(arguments.allocator,0x50);
    name_01.end = "";
    name_01.begin = "$x";
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_07,iVar5),name_01);
    local_110 = (TypeEnum *)ctx->typeInt;
    local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
    local_108 = (ExprBase *)0x0;
    pFStack_100 = (FunctionData *)0x0;
    local_128._0_8_ = pSVar8;
    local_118 = (SynIdentifier *)CONCAT44(extraout_var_07,iVar5);
    SmallArray<ArgumentData,_1U>::push_back(&arguments,(ArgumentData *)local_128);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_08,iVar5),typeName);
    arguments_02.count = arguments.count;
    arguments_02.data = arguments.data;
    arguments_02._12_4_ = 0;
    pTVar9 = ExpressionContext::GetFunctionType(ctx,pSVar8,(TypeBase *)this,arguments_02);
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
    pFVar10 = (FunctionData *)CONCAT44(extraout_var_09,iVar6);
    pAVar2 = ctx->allocator;
    pSVar3 = ctx->scope;
    pTVar11 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    uVar4 = ctx->uniqueFunctionId;
    ctx->uniqueFunctionId = uVar4 + 1;
    pcVar19 = (char *)0x0;
    pcVar20 = pcVar19;
    FunctionData::FunctionData
              (pFVar10,pAVar2,pSVar8,pSVar3,false,false,false,pTVar9,&pTVar11->super_TypeBase,
               (SynIdentifier *)CONCAT44(extraout_var_08,iVar5),(IntrusiveList<MatchData>)ZEXT816(0)
               ,uVar4);
    while (uVar4 = (uint)pcVar19, uVar4 < arguments.count) {
      pAVar12 = SmallArray<ArgumentData,_1U>::operator[](&arguments,uVar4);
      SmallArray<ArgumentData,_4U>::push_back(&pFVar10->arguments,pAVar12);
      pcVar19 = (char *)(ulong)(uVar4 + 1);
    }
    name_04.end = pcVar20;
    name_04.begin = (pFVar10->name->name).end;
    anon_unknown.dwarf_94284::CheckFunctionConflict
              ((anon_unknown_dwarf_94284 *)ctx,(ExpressionContext *)syntax,
               (SynBase *)(pFVar10->name->name).begin,name_04);
    ExpressionContext::AddFunction(ctx,pFVar10);
    ExpressionContext::PushScope(ctx,pFVar10);
    pFVar10->functionScope = ctx->scope;
    variables.head = (ExprVariableDefinition *)0x0;
    variables.tail = (ExprVariableDefinition *)0x0;
    arguments_03.count = arguments.count;
    arguments_03.data = arguments.data;
    arguments_03._12_4_ = 0;
    CreateFunctionArgumentVariables(ctx,pSVar8,pFVar10,arguments_03,&variables);
    pEVar13 = CreateFunctionContextArgument(ctx,pSVar8,pFVar10);
    pFVar10->argumentsSize = pFVar10->functionScope->dataSize;
    expressions.head = (ExprBase *)0x0;
    expressions.tail = (ExprBase *)0x0;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    ExprVariableAccess::ExprVariableAccess
              ((ExprVariableAccess *)CONCAT44(extraout_var_10,iVar5),pSVar8,ctx->typeInt,
               (variables.tail)->variable->variable);
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pp_Var14 = (_func_int **)CONCAT44(extraout_var_11,iVar6);
    *(undefined4 *)(pp_Var14 + 1) = 0x12;
    pp_Var14[2] = (_func_int *)pSVar8;
    pp_Var14[3] = (_func_int *)this;
    pp_Var14[4] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var14 + 5) = 0;
    *pp_Var14 = (_func_int *)&PTR__ExprBase_002239e8;
    pp_Var14[6] = (_func_int *)CONCAT44(extraout_var_10,iVar5);
    *(undefined4 *)(pp_Var14 + 7) = 0xd;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar17 = (ExprBase *)CONCAT44(extraout_var_12,iVar5);
    pTVar7 = ctx->typeVoid;
    pSVar16 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar8,pFVar10,ctx->scope);
    pEVar17->typeID = 0x1c;
    pEVar17->source = pSVar8;
    pEVar17->type = pTVar7;
    pEVar17->next = (ExprBase *)0x0;
    pEVar17->listed = false;
    pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223b70;
    pEVar17[1]._vptr_ExprBase = pp_Var14;
    *(undefined8 *)&pEVar17[1].typeID = 0;
    pEVar17[1].source = pSVar16;
    IntrusiveList<ExprBase>::push_back(&expressions,pEVar17);
    ClosePendingUpvalues(ctx,pFVar10);
    ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
    pEVar17 = (ExprBase *)CONCAT44(extraout_var_13,iVar5);
    pTVar9 = pFVar10->type;
    local_128._0_8_ = expressions.head;
    local_128._8_8_ = expressions.tail;
    pEVar17->typeID = 0x24;
    pEVar17->source = pSVar8;
    pEVar17->type = &pTVar9->super_TypeBase;
    pEVar17->next = (ExprBase *)0x0;
    pEVar17->listed = false;
    pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223ba8;
    pEVar17[1]._vptr_ExprBase = (_func_int **)pFVar10;
    *(ExprVariableDefinition **)&pEVar17[1].typeID = pEVar13;
    pEVar17[1].source = (SynBase *)variables.head;
    pEVar17[1].type = (TypeBase *)variables.tail;
    pEVar17[1].next = (ExprBase *)0x0;
    *(ExprBase **)&pEVar17[1].listed = expressions.head;
    pEVar17[2]._vptr_ExprBase = (_func_int **)expressions.tail;
    *(undefined8 *)&pEVar17[2].typeID = 0;
    pEVar17[2].source = (SynBase *)0x0;
    pFVar10->declaration = pEVar17;
    SmallArray<ExprBase_*,_128U>::push_back(&ctx->definitions,&pFVar10->declaration);
    pSVar8 = (SynBase *)pFVar10->declaration;
    SmallArray<ArgumentData,_1U>::~SmallArray(&arguments);
    ctx->scope = pSVar18;
    ctx->lookupLocation = (SynBase *)0x0;
    memcpy(__env,prevErrorHandler,200);
    ctx->errorHandlerNested = bVar1;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar17 = (ExprBase *)CONCAT44(extraout_var_14,iVar5);
    pTVar7 = ctx->typeVoid;
    pEVar17->typeID = 0x2e;
    pEVar17->source = &syntax->super_SynBase;
    pEVar17->type = pTVar7;
    pEVar17->next = (ExprBase *)0x0;
    pEVar17->listed = false;
    pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00224238;
    pEVar17[1]._vptr_ExprBase = (_func_int **)this;
    *(ExprBase **)&pEVar17[1].typeID = pEVar15;
    pEVar17[1].source = pSVar8;
    return pEVar17;
  }
  NULLC::TraceLeaveTo(uVar4);
  ctx->scope = pSVar18;
  ctx->lookupLocation = (SynBase *)0x0;
  memcpy(__env,prevErrorHandler,200);
  ctx->errorHandlerNested = bVar1;
  longjmp((__jmp_buf_tag *)__env,1);
}

Assistant:

ExprBase* AnalyzeEnumDefinition(ExpressionContext &ctx, SynEnumDefinition *syntax)
{
	CheckTypeConflict(ctx, syntax, syntax->name->name);

	InplaceStr typeName = GetTypeNameInScope(ctx, ctx.scope, syntax->name->name);

	if(LookupTypeByName(ctx, typeName.hash()) != NULL)
		Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(syntax->name->name));

	TypeEnum *enumType = new (ctx.get<TypeEnum>()) TypeEnum(SynIdentifier(syntax->name, typeName), syntax, ctx.scope);

	ctx.AddType(enumType);

	ctx.PushScope(enumType);

	enumType->typeScope = ctx.scope;

	AnalyzeEnumConstants(ctx, enumType, syntax->values, enumType->constants);

	enumType->alignment = ctx.typeInt->alignment;

	ctx.PopScope(SCOPE_TYPE);
	
	ScopeData *scope = ctx.scope;

	// Switch to global scope
	ctx.SwitchToScopeAtPoint(ctx.globalScope, NULL);

	ExprBase *castToInt = NULL;
	ExprBase *castToEnum = NULL;

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		SynBase *syntaxInternal = ctx.MakeInternal(syntax);

		// Create conversion operator int int(enum_type)
		{
			SmallArray<ArgumentData, 1> arguments(ctx.allocator);
			arguments.push_back(ArgumentData(syntaxInternal, false, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$x")), enumType, NULL));

			SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("int"));

			TypeFunction *typeFunction = ctx.GetFunctionType(syntaxInternal, ctx.typeInt, arguments);

			FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, syntaxInternal, ctx.scope, false, false, false, typeFunction, ctx.GetReferenceType(ctx.typeVoid), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

			// Fill in argument data
			for(unsigned i = 0; i < arguments.size(); i++)
				function->arguments.push_back(arguments[i]);

			CheckFunctionConflict(ctx, syntax, function->name->name);

			ctx.AddFunction(function);

			ctx.PushScope(function);

			function->functionScope = ctx.scope;

			IntrusiveList<ExprVariableDefinition> variables;

			CreateFunctionArgumentVariables(ctx, syntaxInternal, function, arguments, variables);

			ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, syntaxInternal, function);

			function->argumentsSize = function->functionScope->dataSize;

			IntrusiveList<ExprBase> expressions;

			ExprBase *access = new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(syntaxInternal, enumType, variables.tail->variable->variable);
			ExprBase *cast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(syntaxInternal, ctx.typeInt, access, EXPR_CAST_REINTERPRET);

			expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(syntaxInternal, ctx.typeVoid, cast, NULL, CreateFunctionUpvalueClose(ctx, syntaxInternal, function, ctx.scope)));

			ClosePendingUpvalues(ctx, function);

			ctx.PopScope(SCOPE_FUNCTION);

			function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(syntaxInternal, function->type, function, contextArgumentDefinition, variables, NULL, expressions, NULL, NULL);

			ctx.definitions.push_back(function->declaration);

			castToInt = function->declaration;
		}

		// Create conversion operator enum_type enum_type(int)
		{
			SmallArray<ArgumentData, 1> arguments(ctx.allocator);
			arguments.push_back(ArgumentData(syntaxInternal, false, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$x")), ctx.typeInt, NULL));

			SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(typeName);

			TypeFunction *typeFunction = ctx.GetFunctionType(syntaxInternal, enumType, arguments);

			FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, syntaxInternal, ctx.scope, false, false, false, typeFunction, ctx.GetReferenceType(ctx.typeVoid), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

			// Fill in argument data
			for(unsigned i = 0; i < arguments.size(); i++)
				function->arguments.push_back(arguments[i]);

			CheckFunctionConflict(ctx, syntax, function->name->name);

			ctx.AddFunction(function);

			ctx.PushScope(function);

			function->functionScope = ctx.scope;

			IntrusiveList<ExprVariableDefinition> variables;

			CreateFunctionArgumentVariables(ctx, syntaxInternal, function, arguments, variables);

			ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, syntaxInternal, function);

			function->argumentsSize = function->functionScope->dataSize;

			IntrusiveList<ExprBase> expressions;

			ExprBase *access = new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(syntaxInternal, ctx.typeInt, variables.tail->variable->variable);
			ExprBase *cast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(syntaxInternal, enumType, access, EXPR_CAST_REINTERPRET);

			expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(syntaxInternal, ctx.typeVoid, cast, NULL, CreateFunctionUpvalueClose(ctx, syntaxInternal, function, ctx.scope)));

			ClosePendingUpvalues(ctx, function);

			ctx.PopScope(SCOPE_FUNCTION);

			function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(syntaxInternal, function->type, function, contextArgumentDefinition, variables, NULL, expressions, NULL, NULL);

			ctx.definitions.push_back(function->declaration);

			castToEnum = function->declaration;
		}
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		longjmp(ctx.errorHandler, 1);
	}

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	return new (ctx.get<ExprEnumDefinition>()) ExprEnumDefinition(syntax, ctx.typeVoid, enumType, castToInt, castToEnum);
}